

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olcPixelGameEngine.h
# Opt level: O3

void __thiscall olc::Renderer_OGL10::DrawDecal(Renderer_OGL10 *this,DecalInstance *decal)

{
  pointer pPVar1;
  pointer pvVar2;
  int32_t iVar3;
  ulong uVar4;
  
  (*(this->super_Renderer)._vptr_Renderer[7])(this,&decal->mode);
  if (decal->decal == (Decal *)0x0) {
    iVar3 = 0;
  }
  else {
    iVar3 = decal->decal->id;
  }
  glBindTexture(0xde1,iVar3);
  glBegin((this->nDecalMode != WIREFRAME) * '\x04' + '\x02');
  if (decal->points != 0) {
    uVar4 = 0;
    do {
      pPVar1 = (decal->tint).super__Vector_base<olc::Pixel,_std::allocator<olc::Pixel>_>._M_impl.
               super__Vector_impl_data._M_start;
      glColor4ub(pPVar1[uVar4].field_0.field_1.r,pPVar1[uVar4].field_0.field_1.g,
                 pPVar1[uVar4].field_0.field_1.b,pPVar1[uVar4].field_0.field_1.a);
      pvVar2 = (decal->uv).
               super__Vector_base<olc::v2d_generic<float>,_std::allocator<olc::v2d_generic<float>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      glTexCoord4f(pvVar2[uVar4].x,pvVar2[uVar4].y,0,
                   (decal->w).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar4]);
      pvVar2 = (decal->pos).
               super__Vector_base<olc::v2d_generic<float>,_std::allocator<olc::v2d_generic<float>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      glVertex2f(pvVar2[uVar4].x,pvVar2[uVar4].y);
      uVar4 = uVar4 + 1;
    } while (uVar4 < decal->points);
  }
  glEnd();
  return;
}

Assistant:

void DrawDecal(const olc::DecalInstance &decal) override
		{
			SetDecalMode(decal.mode);

			if (decal.decal == nullptr)
				glBindTexture(GL_TEXTURE_2D, 0);
			else
				glBindTexture(GL_TEXTURE_2D, decal.decal->id);

			if (nDecalMode == DecalMode::WIREFRAME)
				glBegin(GL_LINE_LOOP);
			else
				glBegin(GL_TRIANGLE_FAN);

			for (uint32_t n = 0; n < decal.points; n++)
			{
				glColor4ub(decal.tint[n].r, decal.tint[n].g, decal.tint[n].b, decal.tint[n].a);
				glTexCoord4f(decal.uv[n].x, decal.uv[n].y, 0.0f, decal.w[n]);
				glVertex2f(decal.pos[n].x, decal.pos[n].y);
			}
			glEnd();
		}